

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateDeferredContextImpl<>
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,IDeviceContext **ppContext)

{
  pointer pvVar1;
  anon_class_24_3_c3e95c83 ConstructObject;
  bool bVar2;
  pointer pvVar3;
  char (*Args_1) [40];
  ulong uVar4;
  DeviceContextVkImpl *pObj;
  uint __val;
  char (*pacVar5) [40];
  string msg;
  DeviceContextDesc Desc;
  string CtxName;
  allocator local_131;
  IDeviceContext **local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_100;
  IDeviceContext ***local_f8;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_130 = ppContext;
  std::mutex::lock(&this->m_DeferredCtxMtx);
  __val = 0;
  while( true ) {
    pacVar5 = (char (*) [40])(ulong)__val;
    pvVar3 = (this->m_wpDeferredContexts).
             super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((char (*) [40])
        ((long)(this->m_wpDeferredContexts).
               super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 4) <= pacVar5) break;
    bVar2 = RefCntWeakPtr<Diligent::DeviceContextVkImpl>::IsValid(pvVar3 + (long)pacVar5);
    if (!bVar2) break;
    __val = __val + 1;
  }
  pvVar3 = (this->m_wpImmediateContexts).
           super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar1 = (this->m_wpImmediateContexts).
           super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_b0,"Deferred context ",&local_131);
  std::__cxx11::to_string(&local_d0,__val);
  std::operator+(&local_90,&local_b0,&local_d0);
  std::operator+(&local_70,&local_90," (ContextId: ");
  uVar4 = (ulong)((long)pvVar3 - (long)pvVar1) >> 4;
  std::__cxx11::to_string(&local_f0,__val + (int)uVar4);
  std::operator+(&local_128,&local_70,&local_f0);
  std::operator+(&local_50,&local_128,")");
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  local_70._M_dataplus._M_p = local_50._M_dataplus._M_p;
  local_70._M_string_length._0_2_ = 0x100;
  local_70._M_string_length._2_1_ = (char)uVar4 + (char)__val;
  local_70._M_string_length._3_1_ = 0xff;
  local_70._12_8_ = 0;
  local_70.field_2._M_allocated_capacity._4_4_ = 0;
  local_f8 = &local_130;
  ConstructObject.Desc = (DeviceContextDesc *)&local_70;
  ConstructObject.this = this;
  ConstructObject.ppContext = local_f8;
  local_108 = this;
  pbStack_100 = &local_70;
  CreateDeviceObject<Diligent::IDeviceContext,Diligent::DeviceContextDesc,Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateDeferredContextImpl<>(Diligent::IDeviceContext**)::_lambda()_1_>
            (this,"Device context",(DeviceContextDesc *)&local_70,ppContext,ConstructObject);
  pObj = (DeviceContextVkImpl *)*local_130;
  if (pObj != (DeviceContextVkImpl *)0x0) {
    pvVar3 = (this->m_wpDeferredContexts).
             super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Args_1 = (char (*) [40])
             ((long)(this->m_wpDeferredContexts).
                    super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 4);
    if (Args_1 < pacVar5 || Args_1 == pacVar5) {
      if (Args_1 != pacVar5) {
        FormatString<char[26],char[40]>
                  (&local_128,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"CtxIndex == m_wpDeferredContexts.size()",Args_1);
        DebugAssertionFailed
                  (local_128._M_dataplus._M_p,"CreateDeferredContextImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                   ,0x2a1);
        std::__cxx11::string::~string((string *)&local_128);
      }
      std::
      vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
      ::resize(&this->m_wpDeferredContexts,(ulong)(__val + 1));
      pObj = (DeviceContextVkImpl *)*local_130;
      pvVar3 = (this->m_wpDeferredContexts).
               super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    RefCntWeakPtr<Diligent::DeviceContextVkImpl>::operator=(pvVar3 + (long)pacVar5,pObj);
  }
  std::__cxx11::string::~string((string *)&local_50);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_DeferredCtxMtx);
  return;
}

Assistant:

void CreateDeferredContextImpl(IDeviceContext** ppContext, const ExtraArgsType&... ExtraArgs)
    {
        std::lock_guard<std::mutex> Guard{m_DeferredCtxMtx};

        Uint32 CtxIndex = 0;
        while (CtxIndex < m_wpDeferredContexts.size() && m_wpDeferredContexts[CtxIndex].IsValid())
            ++CtxIndex;

        const Uint32      ContextId = static_cast<Uint32>(GetNumImmediateContexts()) + CtxIndex;
        const std::string CtxName   = std::string{"Deferred context "} + std::to_string(CtxIndex) + " (ContextId: " + std::to_string(ContextId) + ")";
        DeviceContextDesc Desc{
            CtxName.c_str(),
            COMMAND_QUEUE_TYPE_UNKNOWN,
            true, // IsDeferred
            ContextId,
        };

        CreateDeviceObject("Device context", Desc, ppContext,
                           [&]() //
                           {
                               DeviceContextImplType* pCtxImpl = NEW_RC_OBJ(GetRawAllocator(), "DeviceContext instance", DeviceContextImplType)(
                                   static_cast<RenderDeviceImplType*>(this),
                                   Desc,
                                   ExtraArgs...);
                               pCtxImpl->QueryInterface(IID_DeviceContext, reinterpret_cast<IObject**>(ppContext));
                           });

        if (*ppContext != nullptr)
        {
            if (CtxIndex >= m_wpDeferredContexts.size())
            {
                VERIFY_EXPR(CtxIndex == m_wpDeferredContexts.size());
                m_wpDeferredContexts.resize(CtxIndex + 1);
            }

            m_wpDeferredContexts[CtxIndex] = static_cast<DeviceContextImplType*>(*ppContext);
        }
    }